

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O3

long duckdb::ListNegativeInnerProductFun::GetFunctions(void)

{
  NotImplementedException *this;
  long in_RDI;
  long lVar1;
  pointer pLVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  LogicalType list;
  allocator_type local_3a1;
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  long local_380;
  code *local_378;
  undefined **local_370;
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *local_368;
  undefined1 local_360 [48];
  _Any_data *local_330;
  _Any_data *local_328;
  LogicalType *local_320;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_318;
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  LogicalType local_2e0 [24];
  LogicalType local_2c8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2b0;
  LogicalType local_298 [24];
  ScalarFunction local_280;
  undefined **local_158 [22];
  _Any_data _Stack_a8;
  _Manager_type local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_300[0] = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_300,"list_negative_inner_product","");
  local_380 = in_RDI;
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  if (local_300[0] != local_2f0) {
    operator_delete(local_300[0]);
  }
  duckdb::LogicalType::Real();
  local_320 = local_318.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_318.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_318.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_368 = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                (local_380 + 0x20);
    local_330 = (_Any_data *)(local_158 + 0x16);
    local_328 = (_Any_data *)((long)&local_280 + 0xb0);
    local_370 = &PTR__ScalarFunction_008914d8;
    local_378 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_manager;
    pLVar2 = local_318.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      duckdb::LogicalType::LIST(local_298);
      if (*pLVar2 == (LogicalType)0x17) {
        duckdb::LogicalType::LogicalType((LogicalType *)local_360,local_298);
        duckdb::LogicalType::LogicalType((LogicalType *)(local_360 + 0x18),local_298);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)local_360;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_2b0,__l_00,&local_3a1);
        duckdb::LogicalType::LogicalType(local_2c8,pLVar2);
        local_3a0._8_8_ = 0;
        local_3a0._0_8_ = ListGenericFold<double,duckdb::NegativeInnerProductOp>;
        local_390._8_8_ =
             std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_390._0_8_ =
             std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        duckdb::LogicalType::LogicalType(local_2e0,INVALID);
        duckdb::ScalarFunction::ScalarFunction
                  ((ScalarFunction *)local_158,&local_2b0,local_2c8,local_3a0,0,0,0,0,local_2e0,0,0,
                   0);
        std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>(local_368,(ScalarFunction *)local_158);
        local_158[0] = local_370;
        if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
        }
        if (local_98 != (_Manager_type)0x0) {
          (*local_98)(local_330,local_330,__destroy_functor);
        }
        duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_158);
        duckdb::LogicalType::~LogicalType(local_2e0);
        if ((code *)local_390._0_8_ != (code *)0x0) {
          (*(code *)local_390._0_8_)(local_3a0,local_3a0,3);
        }
        duckdb::LogicalType::~LogicalType(local_2c8);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2b0);
        lVar1 = 0x18;
        do {
          duckdb::LogicalType::~LogicalType((LogicalType *)(local_360 + lVar1));
          lVar1 = lVar1 + -0x18;
        } while (lVar1 != -0x18);
      }
      else {
        if (*pLVar2 != (LogicalType)0x16) {
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_360._0_8_ = local_360 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_360,"List function not implemented for type %s","");
          duckdb::LogicalType::ToString_abi_cxx11_();
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this,(string *)local_360,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0)
          ;
          __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
        }
        duckdb::LogicalType::LogicalType((LogicalType *)local_360,local_298);
        duckdb::LogicalType::LogicalType((LogicalType *)(local_360 + 0x18),local_298);
        __l._M_len = 2;
        __l._M_array = (iterator)local_360;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_2b0,__l,&local_3a1);
        duckdb::LogicalType::LogicalType(local_2c8,pLVar2);
        local_3a0._8_8_ = 0;
        local_3a0._0_8_ = ListGenericFold<float,duckdb::NegativeInnerProductOp>;
        local_390._8_8_ =
             std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_390._0_8_ =
             std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        duckdb::LogicalType::LogicalType(local_2e0,INVALID);
        duckdb::ScalarFunction::ScalarFunction
                  (&local_280,&local_2b0,local_2c8,local_3a0,0,0,0,0,local_2e0,0,0,0);
        std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>(local_368,&local_280);
        local_280._0_8_ = local_370;
        if (local_280.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_280.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_280.function.super__Function_base._M_manager)
                    (local_328,local_328,__destroy_functor);
        }
        duckdb::BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
        duckdb::LogicalType::~LogicalType(local_2e0);
        if ((code *)local_390._0_8_ != (code *)0x0) {
          (*(code *)local_390._0_8_)(local_3a0,local_3a0,3);
        }
        duckdb::LogicalType::~LogicalType(local_2c8);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2b0);
        lVar1 = 0x18;
        do {
          duckdb::LogicalType::~LogicalType((LogicalType *)(local_360 + lVar1));
          lVar1 = lVar1 + -0x18;
        } while (lVar1 != -0x18);
      }
      duckdb::LogicalType::~LogicalType(local_298);
      pLVar2 = pLVar2 + 0x18;
    } while (pLVar2 != local_320);
  }
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_318);
  return local_380;
}

Assistant:

ScalarFunctionSet ListNegativeInnerProductFun::GetFunctions() {
	ScalarFunctionSet set("list_negative_inner_product");
	for (auto &type : LogicalType::Real()) {
		AddListFoldFunction<NegativeInnerProductOp>(set, type);
	}
	return set;
}